

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

iterator __thiscall
cs::tree_type<cs::token_base_*>::merge
          (tree_type<cs::token_base_*> *this,iterator it,tree_type<cs::token_base_*> *tree)

{
  tree_node *ptVar1;
  token_base *ptVar2;
  int iVar3;
  token_base **pptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error *this_00;
  iterator local_40;
  string local_38;
  
  local_40.mData = it.mData;
  if (it.mData != (tree_node *)0x0) {
    ptVar1 = tree->mRoot;
    ptVar2 = ptVar1->data;
    pptVar4 = iterator::data(&local_40);
    *pptVar4 = ptVar2;
    destroy((local_40.mData)->left);
    destroy((local_40.mData)->right);
    iVar3 = copy((EVP_PKEY_CTX *)ptVar1->left,(EVP_PKEY_CTX *)local_40.mData);
    (local_40.mData)->left = (tree_node *)CONCAT44(extraout_var,iVar3);
    iVar3 = copy((EVP_PKEY_CTX *)ptVar1->right,(EVP_PKEY_CTX *)local_40.mData);
    (local_40.mData)->right = (tree_node *)CONCAT44(extraout_var_00,iVar3);
    return (iterator)local_40.mData;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000E","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

iterator merge(iterator it, const tree_type<T> &tree)
		{
			if (!it.usable())
				throw cov::error("E000E");
			tree_node *root = tree.mRoot;
			it.data() = root->data;
			destroy(it.mData->left);
			destroy(it.mData->right);
			it.mData->left = copy(root->left, it.mData);
			it.mData->right = copy(root->right, it.mData);
			return it;
		}